

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

uint luaS_hash(char *str,size_t l,uint seed)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = seed ^ (uint)l;
  if (l != 0) {
    uVar2 = l >> 5;
    do {
      uVar1 = uVar1 ^ (uint)(byte)str[l - 1] + (uVar1 >> 2) + uVar1 * 0x20;
      l = l + ~uVar2;
    } while (uVar2 < l);
  }
  return uVar1;
}

Assistant:

unsigned int luaS_hash(const char *str, size_t l, unsigned int seed) {
    unsigned int h = seed ^cast(unsigned int, l);
    size_t step = (l >> LUAI_HASHLIMIT) + 1;
    for (; l >= step; l -= step)
        h ^= ((h << 5) + (h >> 2) + cast_byte(str[l - 1]));
    return h;
}